

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O1

int32_t __thiscall nuraft::buffer_serializer::get_i32(buffer_serializer *this)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  byte *pbVar4;
  byte *pbVar5;
  overflow_error *this_00;
  uint uVar6;
  
  sVar2 = this->pos_;
  sVar3 = buffer::size(this->buf_);
  if (sVar2 + 4 <= sVar3) {
    pbVar4 = buffer::data_begin(this->buf_);
    pbVar5 = pbVar4 + this->pos_;
    if (this->endian_ == LITTLE) {
      uVar6 = (uint)pbVar5[1] | (uint)pbVar5[2] << 8 | (uint)pbVar5[3] << 0x10;
    }
    else {
      uVar6 = (uint)pbVar5[2] | (uint)pbVar5[1] << 8 | (uint)*pbVar5 << 0x10;
      pbVar5 = pbVar5 + 3;
    }
    bVar1 = *pbVar5;
    pos(this,this->pos_ + 4);
    return (uint)bVar1 | uVar6 << 8;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

int32_t buffer_serializer::get_i32() {
    int32_t ret = 0;
    chk_length(ret);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { get32l(ptr, ret); }
    else                    { get32b(ptr, ret); }
    pos( pos() + sizeof(ret) );
    return ret;
}